

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_ver_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined4 uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  UWORD8 *pUVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  
  uVar3 = nt * 2;
  switch(nt << 0x1e | nt - 4U >> 2) {
  case 0:
    uVar1 = *(undefined4 *)(pu1_ref + (ulong)uVar3 + 1);
    *(undefined4 *)pu1_dst = uVar1;
    lVar9 = (long)dst_strd;
    *(undefined4 *)(pu1_dst + lVar9) = uVar1;
    *(undefined4 *)(pu1_dst + lVar9 * 2) = uVar1;
    *(undefined4 *)(pu1_dst + lVar9 * 3) = uVar1;
    break;
  case 1:
    uVar2 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 1);
    *(undefined8 *)pu1_dst = uVar2;
    lVar9 = (long)dst_strd;
    *(undefined8 *)(pu1_dst + lVar9) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 2) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 3) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 4) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 5) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 6) = uVar2;
    *(undefined8 *)(pu1_dst + lVar9 * 7) = uVar2;
    break;
  case 3:
    lVar9 = (long)dst_strd;
    uVar10 = 0;
    bVar7 = true;
    do {
      bVar11 = bVar7;
      uVar2 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 1);
      uVar4 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 1 + 8);
      *(undefined8 *)(pu1_dst + uVar10 * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + uVar10 * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 1) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 1) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 2) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 2) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 3) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 3) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 4) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 4) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 5) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 5) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 6) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 6) * lVar9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (uVar10 | 7) * lVar9) = uVar2;
      *(undefined8 *)(pu1_dst + (uVar10 | 7) * lVar9 + 8) = uVar4;
      uVar10 = 8;
      bVar7 = false;
    } while (bVar11);
    break;
  case 7:
    uVar2 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 1);
    uVar4 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 1 + 8);
    uVar5 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 0x11);
    uVar6 = *(undefined8 *)(pu1_ref + (ulong)uVar3 + 0x11 + 8);
    bVar7 = true;
    do {
      bVar11 = bVar7;
      *(undefined8 *)pu1_dst = uVar2;
      *(undefined8 *)(pu1_dst + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 2 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 3 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 4) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 4 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 5 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 6 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 7 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + 0x18) = uVar6;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + dst_strd * 8) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 8 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 9) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 9 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 10) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 10 + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe + 8) = uVar4;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf) = uVar2;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf + 8) = uVar4;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10 + 8) = uVar6;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10 + 8) = uVar6;
      pu1_dst = pu1_dst + dst_strd * 0x10;
      bVar7 = false;
    } while (bVar11);
    return;
  }
  if (0 < nt) {
    uVar10 = (ulong)(uint)nt + 1;
    pUVar8 = pu1_dst + ((ulong)(uint)nt - 1) * (long)dst_strd;
    do {
      iVar12 = ((int)((uint)pu1_ref[nt] - (uint)pu1_ref[uVar3]) >> 1) +
               (uint)pu1_ref[(ulong)uVar3 | 1];
      if ((short)iVar12 < 1) {
        iVar12 = 0;
      }
      if (0xfe < (short)iVar12) {
        iVar12 = 0xff;
      }
      *pUVar8 = (UWORD8)iVar12;
      uVar10 = uVar10 - 1;
      nt = nt + 1;
      pUVar8 = pUVar8 + -(long)dst_strd;
    } while (1 < uVar10);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ver_ssse3(UWORD8 *pu1_ref,
                                     WORD32 src_strd,
                                     UWORD8 *pu1_dst,
                                     WORD32 dst_strd,
                                     WORD32 nt,
                                     WORD32 mode)
{
    WORD32 row;
    WORD16 s2_predpixel;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp0, src_temp2;
    UNUSED(src_strd);
    UNUSED(mode);


    if(nt == 32)
    {
        __m128i temp1, temp2;
        WORD32 itr_count;

        temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
        temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp2);

            pu1_dst += 16 * dst_strd;
        }
    }
    else
    {
        /* Replication to next columns*/

        if(nt == 4)
        {
            int temp1;

            src_temp2 =   _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            temp1 = _mm_cvtsi128_si32(src_temp2);

            /* loding 4-bit 8 pixels values */
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp1;

        }
        else if(nt == 8)
        {

            src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            _mm_storel_epi64((__m128i *)(pu1_dst + ((0) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp0);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {

                src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp0);

            }

        }

        /*Filtering done for the 1st column */
        for(row = nt - 1; row >= 0; row--)
        {
            s2_predpixel = pu1_ref[two_nt + 1]
                            + ((pu1_ref[two_nt - 1 - row] - pu1_ref[two_nt]) >> 1);
            pu1_dst[row * dst_strd] = CLIP_U8(s2_predpixel);
        }


    }
}